

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition.cc
# Opt level: O0

void __thiscall
transition_empty_guard_Test::~transition_empty_guard_Test(transition_empty_guard_Test *this)

{
  transition_empty_guard_Test *this_local;
  
  ~transition_empty_guard_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(transition, empty_guard) {
    auto transition = make_transition(
        state<s1>,
        event<e1>,
        _,
        [](auto& s, auto& e) {
            (void)s;
            (void)e;
            return s2{};
        },
        state<s2>);

    EXPECT_EQ(transition.guard(), true);

    auto s = s1{};
    auto e = e1{};
    static_assert(std::is_same<decltype(transition.action(s, e)), s2>::value, "");
}